

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUSettings.cpp
# Opt level: O2

bool __thiscall RTIMUSettings::loadSettings(RTIMUSettings *this)

{
  int iVar1;
  uint uVar2;
  FILE *pFVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  RTFLOAT ftemp;
  char val [200];
  char key [200];
  char buf [200];
  
  setDefaults(this);
  pFVar3 = fopen(this->m_filename,"r");
  this->m_fd = (FILE *)pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    puts("Settings file not found. Using defaults and creating settings file");
    fflush(_stdout);
    iVar1 = (*(this->super_RTIMUHal)._vptr_RTIMUHal[3])(this);
    return SUB41(iVar1,0);
  }
  while( true ) {
    do {
      pcVar4 = fgets(buf,200,(FILE *)this->m_fd);
      if (pcVar4 == (char *)0x0) {
        printf("Settings file %s loaded\n",this->m_filename);
        fflush(_stdout);
        fclose((FILE *)this->m_fd);
        iVar1 = (*(this->super_RTIMUHal)._vptr_RTIMUHal[3])(this);
        return (bool)(char)iVar1;
      }
    } while (((ulong)(byte)buf[0] < 0x24) &&
            ((0x900000400U >> ((ulong)(byte)buf[0] & 0x3f) & 1) != 0));
    iVar1 = __isoc99_sscanf(buf,"%[^=]=%s",key,val);
    if (iVar1 != 2) break;
    if (CONCAT17(key[7],CONCAT16(key[6],CONCAT15(key[5],CONCAT14(key[4],CONCAT13(key[3],CONCAT12(key
                                                  [2],CONCAT11(key[1],key[0]))))))) ==
        0x65707954554d49) {
      iVar1 = atoi(val);
      *(int *)&(this->super_RTIMUHal).field_0x1c = iVar1;
    }
    else {
      iVar1 = bcmp(key,"FusionType",0xb);
      if (iVar1 == 0) {
        iVar1 = atoi(val);
        this->m_fusionType = iVar1;
      }
      else {
        iVar1 = bcmp(key,"BusIsI2C",9);
        if (iVar1 == 0) {
          iVar1 = bcmp(val,"true",5);
          (this->super_RTIMUHal).m_busIsI2C = iVar1 == 0;
        }
        else {
          iVar1 = bcmp(key,"I2CBus",7);
          if (iVar1 == 0) {
            iVar1 = atoi(val);
            (this->super_RTIMUHal).m_I2CBus = (uchar)iVar1;
          }
          else {
            iVar1 = bcmp(key,"SPIBus",7);
            if (iVar1 == 0) {
              iVar1 = atoi(val);
              (this->super_RTIMUHal).m_SPIBus = (uchar)iVar1;
            }
            else {
              iVar1 = bcmp(key,"SPISelect",10);
              if (iVar1 == 0) {
                iVar1 = atoi(val);
                (this->super_RTIMUHal).m_SPISelect = (uchar)iVar1;
              }
              else {
                iVar1 = bcmp(key,"SPISpeed",9);
                if (iVar1 == 0) {
                  uVar2 = atoi(val);
                  (this->super_RTIMUHal).m_SPISpeed = uVar2;
                }
                else {
                  auVar5[0] = -(key[0] == 'I');
                  auVar5[1] = -(key[1] == '2');
                  auVar5[2] = -(key[2] == 'C');
                  auVar5[3] = -(key[3] == 'S');
                  auVar5[4] = -(key[4] == 'l');
                  auVar5[5] = -(key[5] == 'a');
                  auVar5[6] = -(key[6] == 'v');
                  auVar5[7] = -(key[7] == 'e');
                  auVar5[8] = -(key[8] == 'A');
                  auVar5[9] = -(key[9] == 'd');
                  auVar5[10] = -(key[10] == 'd');
                  auVar5[0xb] = -(key[0xb] == 'r');
                  auVar5[0xc] = -(key[0xc] == 'e');
                  auVar5[0xd] = -(key[0xd] == 's');
                  auVar5[0xe] = -(key[0xe] == 's');
                  auVar5[0xf] = -(key[0xf] == '\0');
                  if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
                    iVar1 = atoi(val);
                    this->m_I2CSlaveAddress = (uchar)iVar1;
                  }
                  else {
                    iVar1 = bcmp(key,"AxisRotation",0xd);
                    if (iVar1 == 0) {
                      iVar1 = atoi(val);
                      this->m_axisRotation = iVar1;
                    }
                    else {
                      iVar1 = bcmp(key,"PressureType",0xd);
                      if (iVar1 == 0) {
                        iVar1 = atoi(val);
                        this->m_pressureType = iVar1;
                      }
                      else {
                        iVar1 = bcmp(key,"I2CPressureAddress",0x13);
                        if (iVar1 == 0) {
                          iVar1 = atoi(val);
                          this->m_I2CPressureAddress = (uchar)iVar1;
                        }
                        else {
                          iVar1 = bcmp(key,"HumidityType",0xd);
                          if (iVar1 == 0) {
                            iVar1 = atoi(val);
                            this->m_humidityType = iVar1;
                          }
                          else {
                            iVar1 = bcmp(key,"I2CHumidityAddress",0x13);
                            if (iVar1 == 0) {
                              iVar1 = atoi(val);
                              this->m_I2CHumidityAddress = (uchar)iVar1;
                            }
                            else {
                              auVar6[0] = -(key[0] == 'C');
                              auVar6[1] = -(key[1] == 'o');
                              auVar6[2] = -(key[2] == 'm');
                              auVar6[3] = -(key[3] == 'p');
                              auVar6[4] = -(key[4] == 'a');
                              auVar6[5] = -(key[5] == 's');
                              auVar6[6] = -(key[6] == 's');
                              auVar6[7] = -(key[7] == 'C');
                              auVar6[8] = -(key[8] == 'a');
                              auVar6[9] = -(key[9] == 'l');
                              auVar6[10] = -(key[10] == 'V');
                              auVar6[0xb] = -(key[0xb] == 'a');
                              auVar6[0xc] = -(key[0xc] == 'l');
                              auVar6[0xd] = -(key[0xd] == 'i');
                              auVar6[0xe] = -(key[0xe] == 'd');
                              auVar6[0xf] = -(key[0xf] == '\0');
                              if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                                          (ushort)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
                                iVar1 = bcmp(val,"true",5);
                                this->m_compassCalValid = iVar1 == 0;
                              }
                              else {
                                iVar1 = bcmp(key,"CompassCalMinX",0xf);
                                if (iVar1 == 0) {
                                  __isoc99_sscanf(val,"%f",&ftemp);
                                  (this->m_compassCalMin).m_data[0] = ftemp;
                                }
                                else {
                                  iVar1 = bcmp(key,"CompassCalMinY",0xf);
                                  if (iVar1 == 0) {
                                    __isoc99_sscanf(val,"%f",&ftemp);
                                    (this->m_compassCalMin).m_data[1] = ftemp;
                                  }
                                  else {
                                    iVar1 = bcmp(key,"CompassCalMinZ",0xf);
                                    if (iVar1 == 0) {
                                      __isoc99_sscanf(val,"%f",&ftemp);
                                      (this->m_compassCalMin).m_data[2] = ftemp;
                                    }
                                    else {
                                      iVar1 = bcmp(key,"CompassCalMaxX",0xf);
                                      if (iVar1 == 0) {
                                        __isoc99_sscanf(val,"%f",&ftemp);
                                        (this->m_compassCalMax).m_data[0] = ftemp;
                                      }
                                      else {
                                        iVar1 = bcmp(key,"CompassCalMaxY",0xf);
                                        if (iVar1 == 0) {
                                          __isoc99_sscanf(val,"%f",&ftemp);
                                          (this->m_compassCalMax).m_data[1] = ftemp;
                                        }
                                        else {
                                          iVar1 = bcmp(key,"CompassCalMaxZ",0xf);
                                          if (iVar1 == 0) {
                                            __isoc99_sscanf(val,"%f",&ftemp);
                                            (this->m_compassCalMax).m_data[2] = ftemp;
                                          }
                                          else {
                                            iVar1 = bcmp(key,"compassAdjDeclination",0x16);
                                            if (iVar1 == 0) {
                                              __isoc99_sscanf(val,"%f",&ftemp);
                                              this->m_compassAdjDeclination = ftemp;
                                            }
                                            else {
                                              iVar1 = bcmp(key,"compassCalEllipsoidValid",0x19);
                                              if (iVar1 == 0) {
                                                iVar1 = bcmp(val,"true",5);
                                                this->m_compassCalEllipsoidValid = iVar1 == 0;
                                              }
                                              else {
                                                iVar1 = bcmp(key,"compassCalOffsetX",0x12);
                                                if (iVar1 == 0) {
                                                  __isoc99_sscanf(val,"%f",&ftemp);
                                                  (this->m_compassCalEllipsoidOffset).m_data[0] =
                                                       ftemp;
                                                }
                                                else {
                                                  iVar1 = bcmp(key,"compassCalOffsetY",0x12);
                                                  if (iVar1 == 0) {
                                                    __isoc99_sscanf(val,"%f",&ftemp);
                                                    (this->m_compassCalEllipsoidOffset).m_data[1] =
                                                         ftemp;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"compassCalOffsetZ",0x12);
                                                    if (iVar1 == 0) {
                                                      __isoc99_sscanf(val,"%f",&ftemp);
                                                      (this->m_compassCalEllipsoidOffset).m_data[2]
                                                           = ftemp;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,"compassCalCorr11",0x11);
                                                      if (iVar1 == 0) {
                                                        __isoc99_sscanf(val,"%f",&ftemp);
                                                        this->m_compassCalEllipsoidCorr[0][0] =
                                                             ftemp;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"compassCalCorr12",0x11);
                                                        if (iVar1 == 0) {
                                                          __isoc99_sscanf(val,"%f",&ftemp);
                                                          this->m_compassCalEllipsoidCorr[0][1] =
                                                               ftemp;
                                                        }
                                                        else {
                                                          iVar1 = bcmp(key,"compassCalCorr13",0x11);
                                                          if (iVar1 == 0) {
                                                            __isoc99_sscanf(val,"%f",&ftemp);
                                                            this->m_compassCalEllipsoidCorr[0][2] =
                                                                 ftemp;
                                                          }
                                                          else {
                                                            iVar1 = bcmp(key,"compassCalCorr21",0x11
                                                                        );
                                                            if (iVar1 == 0) {
                                                              __isoc99_sscanf(val,"%f",&ftemp);
                                                              this->m_compassCalEllipsoidCorr[1][0]
                                                                   = ftemp;
                                                            }
                                                            else {
                                                              iVar1 = bcmp(key,"compassCalCorr22",
                                                                           0x11);
                                                              if (iVar1 == 0) {
                                                                __isoc99_sscanf(val,"%f",&ftemp);
                                                                this->m_compassCalEllipsoidCorr[1]
                                                                [1] = ftemp;
                                                              }
                                                              else {
                                                                iVar1 = bcmp(key,"compassCalCorr23",
                                                                             0x11);
                                                                if (iVar1 == 0) {
                                                                  __isoc99_sscanf(val,"%f",&ftemp);
                                                                  this->m_compassCalEllipsoidCorr[1]
                                                                  [2] = ftemp;
                                                                }
                                                                else {
                                                                  iVar1 = bcmp(key,
                                                  "compassCalCorr31",0x11);
                                                  if (iVar1 == 0) {
                                                    __isoc99_sscanf(val,"%f",&ftemp);
                                                    this->m_compassCalEllipsoidCorr[2][0] = ftemp;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"compassCalCorr32",0x11);
                                                    if (iVar1 == 0) {
                                                      __isoc99_sscanf(val,"%f",&ftemp);
                                                      this->m_compassCalEllipsoidCorr[2][1] = ftemp;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,"compassCalCorr33",0x11);
                                                      if (iVar1 == 0) {
                                                        __isoc99_sscanf(val,"%f",&ftemp);
                                                        this->m_compassCalEllipsoidCorr[2][2] =
                                                             ftemp;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"AccelCalValid",0xe);
                                                        if (iVar1 == 0) {
                                                          iVar1 = bcmp(val,"true",5);
                                                          this->m_accelCalValid = iVar1 == 0;
                                                        }
                                                        else {
                                                          iVar1 = bcmp(key,"AccelCalMinX",0xd);
                                                          if (iVar1 == 0) {
                                                            __isoc99_sscanf(val,"%f",&ftemp);
                                                            (this->m_accelCalMin).m_data[0] = ftemp;
                                                          }
                                                          else {
                                                            iVar1 = bcmp(key,"AccelCalMinY",0xd);
                                                            if (iVar1 == 0) {
                                                              __isoc99_sscanf(val,"%f",&ftemp);
                                                              (this->m_accelCalMin).m_data[1] =
                                                                   ftemp;
                                                            }
                                                            else {
                                                              iVar1 = bcmp(key,"AccelCalMinZ",0xd);
                                                              if (iVar1 == 0) {
                                                                __isoc99_sscanf(val,"%f",&ftemp);
                                                                (this->m_accelCalMin).m_data[2] =
                                                                     ftemp;
                                                              }
                                                              else {
                                                                iVar1 = bcmp(key,"AccelCalMaxX",0xd)
                                                                ;
                                                                if (iVar1 == 0) {
                                                                  __isoc99_sscanf(val,"%f",&ftemp);
                                                                  (this->m_accelCalMax).m_data[0] =
                                                                       ftemp;
                                                                }
                                                                else {
                                                                  iVar1 = bcmp(key,"AccelCalMaxY",
                                                                               0xd);
                                                                  if (iVar1 == 0) {
                                                                    __isoc99_sscanf(val,"%f",&ftemp)
                                                                    ;
                                                                    (this->m_accelCalMax).m_data[1]
                                                                         = ftemp;
                                                                  }
                                                                  else {
                                                                    iVar1 = bcmp(key,"AccelCalMaxZ",
                                                                                 0xd);
                                                                    if (iVar1 == 0) {
                                                                      __isoc99_sscanf(val,"%f",&
                                                  ftemp);
                                                  (this->m_accelCalMax).m_data[2] = ftemp;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"GyroBiasValid",0xe);
                                                    if (iVar1 == 0) {
                                                      iVar1 = bcmp(val,"true",5);
                                                      this->m_gyroBiasValid = iVar1 == 0;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,"GyroBiasX",10);
                                                      if (iVar1 == 0) {
                                                        __isoc99_sscanf(val,"%f",&ftemp);
                                                        (this->m_gyroBias).m_data[0] = ftemp;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"GyroBiasY",10);
                                                        if (iVar1 == 0) {
                                                          __isoc99_sscanf(val,"%f",&ftemp);
                                                          (this->m_gyroBias).m_data[1] = ftemp;
                                                        }
                                                        else {
                                                          iVar1 = bcmp(key,"GyroBiasZ",10);
                                                          if (iVar1 == 0) {
                                                            __isoc99_sscanf(val,"%f",&ftemp);
                                                            (this->m_gyroBias).m_data[2] = ftemp;
                                                          }
                                                          else {
                                                            iVar1 = bcmp(key,
                                                  "MPU9150GyroAccelSampleRate",0x1b);
                                                  if (iVar1 == 0) {
                                                    iVar1 = atoi(val);
                                                    this->m_MPU9150GyroAccelSampleRate = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"MPU9150CompassSampleRate",0x19
                                                                );
                                                    if (iVar1 == 0) {
                                                      iVar1 = atoi(val);
                                                      this->m_MPU9150CompassSampleRate = iVar1;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,"MPU9150GyroAccelLpf",0x14);
                                                      if (iVar1 == 0) {
                                                        iVar1 = atoi(val);
                                                        this->m_MPU9150GyroAccelLpf = iVar1;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"MPU9150GyroFSR",0xf);
                                                        if (iVar1 == 0) {
                                                          iVar1 = atoi(val);
                                                          this->m_MPU9150GyroFsr = iVar1;
                                                        }
                                                        else {
                                                          auVar7[0] = -(key[0] == 'M');
                                                          auVar7[1] = -(key[1] == 'P');
                                                          auVar7[2] = -(key[2] == 'U');
                                                          auVar7[3] = -(key[3] == '9');
                                                          auVar7[4] = -(key[4] == '1');
                                                          auVar7[5] = -(key[5] == '5');
                                                          auVar7[6] = -(key[6] == '0');
                                                          auVar7[7] = -(key[7] == 'A');
                                                          auVar7[8] = -(key[8] == 'c');
                                                          auVar7[9] = -(key[9] == 'c');
                                                          auVar7[10] = -(key[10] == 'e');
                                                          auVar7[0xb] = -(key[0xb] == 'l');
                                                          auVar7[0xc] = -(key[0xc] == 'F');
                                                          auVar7[0xd] = -(key[0xd] == 'S');
                                                          auVar7[0xe] = -(key[0xe] == 'R');
                                                          auVar7[0xf] = -(key[0xf] == '\0');
                                                          if ((ushort)((ushort)(SUB161(auVar7 >> 7,0
                                                                                      ) & 1) |
                                                                       (ushort)(SUB161(auVar7 >> 0xf
                                                                                       ,0) & 1) << 1
                                                                       | (ushort)(SUB161(auVar7 >> 
                                                  0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
                                                    iVar1 = atoi(val);
                                                    this->m_MPU9150AccelFsr = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"MPU9250GyroAccelSampleRate",
                                                                 0x1b);
                                                    if (iVar1 == 0) {
                                                      iVar1 = atoi(val);
                                                      this->m_MPU9250GyroAccelSampleRate = iVar1;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,"MPU9250CompassSampleRate",
                                                                   0x19);
                                                      if (iVar1 == 0) {
                                                        iVar1 = atoi(val);
                                                        this->m_MPU9250CompassSampleRate = iVar1;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"MPU9250GyroLpf",0xf);
                                                        if (iVar1 == 0) {
                                                          iVar1 = atoi(val);
                                                          this->m_MPU9250GyroLpf = iVar1;
                                                        }
                                                        else {
                                                          auVar8[0] = -(key[0] == 'M');
                                                          auVar8[1] = -(key[1] == 'P');
                                                          auVar8[2] = -(key[2] == 'U');
                                                          auVar8[3] = -(key[3] == '9');
                                                          auVar8[4] = -(key[4] == '2');
                                                          auVar8[5] = -(key[5] == '5');
                                                          auVar8[6] = -(key[6] == '0');
                                                          auVar8[7] = -(key[7] == 'A');
                                                          auVar8[8] = -(key[8] == 'c');
                                                          auVar8[9] = -(key[9] == 'c');
                                                          auVar8[10] = -(key[10] == 'e');
                                                          auVar8[0xb] = -(key[0xb] == 'l');
                                                          auVar8[0xc] = -(key[0xc] == 'L');
                                                          auVar8[0xd] = -(key[0xd] == 'p');
                                                          auVar8[0xe] = -(key[0xe] == 'f');
                                                          auVar8[0xf] = -(key[0xf] == '\0');
                                                          if ((ushort)((ushort)(SUB161(auVar8 >> 7,0
                                                                                      ) & 1) |
                                                                       (ushort)(SUB161(auVar8 >> 0xf
                                                                                       ,0) & 1) << 1
                                                                       | (ushort)(SUB161(auVar8 >> 
                                                  0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
                                                    iVar1 = atoi(val);
                                                    this->m_MPU9250AccelLpf = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"MPU9250GyroFSR",0xf);
                                                    if (iVar1 == 0) {
                                                      iVar1 = atoi(val);
                                                      this->m_MPU9250GyroFsr = iVar1;
                                                    }
                                                    else {
                                                      auVar9[0] = -(key[0] == 'M');
                                                      auVar9[1] = -(key[1] == 'P');
                                                      auVar9[2] = -(key[2] == 'U');
                                                      auVar9[3] = -(key[3] == '9');
                                                      auVar9[4] = -(key[4] == '2');
                                                      auVar9[5] = -(key[5] == '5');
                                                      auVar9[6] = -(key[6] == '0');
                                                      auVar9[7] = -(key[7] == 'A');
                                                      auVar9[8] = -(key[8] == 'c');
                                                      auVar9[9] = -(key[9] == 'c');
                                                      auVar9[10] = -(key[10] == 'e');
                                                      auVar9[0xb] = -(key[0xb] == 'l');
                                                      auVar9[0xc] = -(key[0xc] == 'F');
                                                      auVar9[0xd] = -(key[0xd] == 'S');
                                                      auVar9[0xe] = -(key[0xe] == 'R');
                                                      auVar9[0xf] = -(key[0xf] == '\0');
                                                      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar9 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar9 >> 0x17,0)
                                                                           & 1) << 2 |
                                                                   (ushort)(SUB161(auVar9 >> 0x1f,0)
                                                                           & 1) << 3 |
                                                                   (ushort)(SUB161(auVar9 >> 0x27,0)
                                                                           & 1) << 4 |
                                                                   (ushort)(SUB161(auVar9 >> 0x2f,0)
                                                                           & 1) << 5 |
                                                                   (ushort)(SUB161(auVar9 >> 0x37,0)
                                                                           & 1) << 6 |
                                                                   (ushort)(SUB161(auVar9 >> 0x3f,0)
                                                                           & 1) << 7 |
                                                                   (ushort)(SUB161(auVar9 >> 0x47,0)
                                                                           & 1) << 8 |
                                                                   (ushort)(SUB161(auVar9 >> 0x4f,0)
                                                                           & 1) << 9 |
                                                                   (ushort)(SUB161(auVar9 >> 0x57,0)
                                                                           & 1) << 10 |
                                                                   (ushort)(SUB161(auVar9 >> 0x5f,0)
                                                                           & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar9 >> 0x67,0)
                                                                           & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar9 >> 0x6f,0)
                                                                           & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar9 >> 0x77,0)
                                                                           & 1) << 0xe |
                                                                  (ushort)(auVar9[0xf] >> 7) << 0xf)
                                                          == 0xffff) {
                                                        iVar1 = atoi(val);
                                                        this->m_MPU9250AccelFsr = iVar1;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"GD20HM303DGyroSampleRate",
                                                                     0x19);
                                                        if (iVar1 == 0) {
                                                          iVar1 = atoi(val);
                                                          this->m_GD20HM303DGyroSampleRate = iVar1;
                                                        }
                                                        else {
                                                          iVar1 = bcmp(key,"GD20HM303DGyroFsr",0x12)
                                                          ;
                                                          if (iVar1 == 0) {
                                                            iVar1 = atoi(val);
                                                            this->m_GD20HM303DGyroFsr = iVar1;
                                                          }
                                                          else {
                                                            iVar1 = bcmp(key,"GD20HM303DGyroHpf",
                                                                         0x12);
                                                            if (iVar1 == 0) {
                                                              iVar1 = atoi(val);
                                                              this->m_GD20HM303DGyroHpf = iVar1;
                                                            }
                                                            else {
                                                              iVar1 = bcmp(key,"GD20HM303DGyroBW",
                                                                           0x11);
                                                              if (iVar1 == 0) {
                                                                iVar1 = atoi(val);
                                                                this->m_GD20HM303DGyroBW = iVar1;
                                                              }
                                                              else {
                                                                iVar1 = bcmp(key,
                                                  "GD20HM303DAccelSampleRate",0x1a);
                                                  if (iVar1 == 0) {
                                                    iVar1 = atoi(val);
                                                    this->m_GD20HM303DAccelSampleRate = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"GD20HM303DAccelFsr",0x13);
                                                    if (iVar1 == 0) {
                                                      iVar1 = atoi(val);
                                                      this->m_GD20HM303DAccelFsr = iVar1;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,"GD20HM303DAccelLpf",0x13);
                                                      if (iVar1 == 0) {
                                                        iVar1 = atoi(val);
                                                        this->m_GD20HM303DAccelLpf = iVar1;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,
                                                  "GD20HM303DCompassSampleRate",0x1c);
                                                  if (iVar1 == 0) {
                                                    iVar1 = atoi(val);
                                                    this->m_GD20HM303DCompassSampleRate = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"GD20HM303DCompassFsr",0x15);
                                                    if (iVar1 == 0) {
                                                      iVar1 = atoi(val);
                                                      this->m_GD20HM303DCompassFsr = iVar1;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,"GD20M303DLHCGyroSampleRate",
                                                                   0x1b);
                                                      if (iVar1 == 0) {
                                                        iVar1 = atoi(val);
                                                        this->m_GD20M303DLHCGyroSampleRate = iVar1;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"GD20M303DLHCGyroFsr",0x14)
                                                        ;
                                                        if (iVar1 == 0) {
                                                          iVar1 = atoi(val);
                                                          this->m_GD20M303DLHCGyroFsr = iVar1;
                                                        }
                                                        else {
                                                          iVar1 = bcmp(key,"GD20M303DLHCGyroHpf",
                                                                       0x14);
                                                          if (iVar1 == 0) {
                                                            iVar1 = atoi(val);
                                                            this->m_GD20M303DLHCGyroHpf = iVar1;
                                                          }
                                                          else {
                                                            iVar1 = bcmp(key,"GD20M303DLHCGyroBW",
                                                                         0x13);
                                                            if (iVar1 == 0) {
                                                              iVar1 = atoi(val);
                                                              this->m_GD20M303DLHCGyroBW = iVar1;
                                                            }
                                                            else {
                                                              iVar1 = bcmp(key,
                                                  "GD20M303DLHCAccelSampleRate",0x1c);
                                                  if (iVar1 == 0) {
                                                    iVar1 = atoi(val);
                                                    this->m_GD20M303DLHCAccelSampleRate = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"GD20M303DLHCAccelFsr",0x15);
                                                    if (iVar1 == 0) {
                                                      iVar1 = atoi(val);
                                                      this->m_GD20M303DLHCAccelFsr = iVar1;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,
                                                  "GD20M303DLHCCompassSampleRate",0x1e);
                                                  if (iVar1 == 0) {
                                                    iVar1 = atoi(val);
                                                    this->m_GD20M303DLHCCompassSampleRate = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"GD20M303DLHCCompassFsr",0x17);
                                                    if (iVar1 == 0) {
                                                      iVar1 = atoi(val);
                                                      this->m_GD20M303DLHCCompassFsr = iVar1;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,"GD20HM303DLHCGyroSampleRate"
                                                                   ,0x1c);
                                                      if (iVar1 == 0) {
                                                        iVar1 = atoi(val);
                                                        this->m_GD20HM303DLHCGyroSampleRate = iVar1;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"GD20HM303DLHCGyroFsr",0x15
                                                                    );
                                                        if (iVar1 == 0) {
                                                          iVar1 = atoi(val);
                                                          this->m_GD20HM303DLHCGyroFsr = iVar1;
                                                        }
                                                        else {
                                                          iVar1 = bcmp(key,"GD20HM303DLHCGyroHpf",
                                                                       0x15);
                                                          if (iVar1 == 0) {
                                                            iVar1 = atoi(val);
                                                            this->m_GD20HM303DLHCGyroHpf = iVar1;
                                                          }
                                                          else {
                                                            iVar1 = bcmp(key,"GD20HM303DLHCGyroBW",
                                                                         0x14);
                                                            if (iVar1 == 0) {
                                                              iVar1 = atoi(val);
                                                              this->m_GD20HM303DLHCGyroBW = iVar1;
                                                            }
                                                            else {
                                                              iVar1 = bcmp(key,
                                                  "GD20HM303DLHCAccelSampleRate",0x1d);
                                                  if (iVar1 == 0) {
                                                    iVar1 = atoi(val);
                                                    this->m_GD20HM303DLHCAccelSampleRate = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"GD20HM303DLHCAccelFsr",0x16);
                                                    if (iVar1 == 0) {
                                                      iVar1 = atoi(val);
                                                      this->m_GD20HM303DLHCAccelFsr = iVar1;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,
                                                  "GD20HM303DLHCCompassSampleRate",0x1f);
                                                  if (iVar1 == 0) {
                                                    iVar1 = atoi(val);
                                                    this->m_GD20HM303DLHCCompassSampleRate = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"GD20HM303DLHCCompassFsr",0x18)
                                                    ;
                                                    if (iVar1 == 0) {
                                                      iVar1 = atoi(val);
                                                      this->m_GD20HM303DLHCCompassFsr = iVar1;
                                                    }
                                                    else {
                                                      iVar1 = bcmp(key,"LSM9DS0GyroSampleRate",0x16)
                                                      ;
                                                      if (iVar1 == 0) {
                                                        iVar1 = atoi(val);
                                                        this->m_LSM9DS0GyroSampleRate = iVar1;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"LSM9DS0GyroFsr",0xf);
                                                        if (iVar1 == 0) {
                                                          iVar1 = atoi(val);
                                                          this->m_LSM9DS0GyroFsr = iVar1;
                                                        }
                                                        else {
                                                          iVar1 = bcmp(key,"LSM9DS0GyroHpf",0xf);
                                                          if (iVar1 == 0) {
                                                            iVar1 = atoi(val);
                                                            this->m_LSM9DS0GyroHpf = iVar1;
                                                          }
                                                          else {
                                                            iVar1 = bcmp(key,"LSM9DS0GyroBW",0xe);
                                                            if (iVar1 == 0) {
                                                              iVar1 = atoi(val);
                                                              this->m_LSM9DS0GyroBW = iVar1;
                                                            }
                                                            else {
                                                              iVar1 = bcmp(key,
                                                  "LSM9DS0AccelSampleRate",0x17);
                                                  if (iVar1 == 0) {
                                                    iVar1 = atoi(val);
                                                    this->m_LSM9DS0AccelSampleRate = iVar1;
                                                  }
                                                  else {
                                                    auVar10[0] = -(key[0] == 'L');
                                                    auVar10[1] = -(key[1] == 'S');
                                                    auVar10[2] = -(key[2] == 'M');
                                                    auVar10[3] = -(key[3] == '9');
                                                    auVar10[4] = -(key[4] == 'D');
                                                    auVar10[5] = -(key[5] == 'S');
                                                    auVar10[6] = -(key[6] == '0');
                                                    auVar10[7] = -(key[7] == 'A');
                                                    auVar10[8] = -(key[8] == 'c');
                                                    auVar10[9] = -(key[9] == 'c');
                                                    auVar10[10] = -(key[10] == 'e');
                                                    auVar10[0xb] = -(key[0xb] == 'l');
                                                    auVar10[0xc] = -(key[0xc] == 'F');
                                                    auVar10[0xd] = -(key[0xd] == 's');
                                                    auVar10[0xe] = -(key[0xe] == 'r');
                                                    auVar10[0xf] = -(key[0xf] == '\0');
                                                    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar10 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar10 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar10 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar10 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar10 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar10 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar10 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar10 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar10 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar10 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar10 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar10 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar10 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar10 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(auVar10[0xf] >> 7) << 0xf)
                                                        == 0xffff) {
                                                      iVar1 = atoi(val);
                                                      this->m_LSM9DS0AccelFsr = iVar1;
                                                    }
                                                    else {
                                                      auVar11[0] = -(key[0] == 'L');
                                                      auVar11[1] = -(key[1] == 'S');
                                                      auVar11[2] = -(key[2] == 'M');
                                                      auVar11[3] = -(key[3] == '9');
                                                      auVar11[4] = -(key[4] == 'D');
                                                      auVar11[5] = -(key[5] == 'S');
                                                      auVar11[6] = -(key[6] == '0');
                                                      auVar11[7] = -(key[7] == 'A');
                                                      auVar11[8] = -(key[8] == 'c');
                                                      auVar11[9] = -(key[9] == 'c');
                                                      auVar11[10] = -(key[10] == 'e');
                                                      auVar11[0xb] = -(key[0xb] == 'l');
                                                      auVar11[0xc] = -(key[0xc] == 'L');
                                                      auVar11[0xd] = -(key[0xd] == 'p');
                                                      auVar11[0xe] = -(key[0xe] == 'f');
                                                      auVar11[0xf] = -(key[0xf] == '\0');
                                                      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar11 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar11 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar11 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar11 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar11 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar11 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar11 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar11 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar11 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar11 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar11 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar11 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar11 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar11 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(auVar11[0xf] >> 7) << 0xf
                                                                  ) == 0xffff) {
                                                        iVar1 = atoi(val);
                                                        this->m_LSM9DS0AccelLpf = iVar1;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"LSM9DS0CompassSampleRate",
                                                                     0x19);
                                                        if (iVar1 == 0) {
                                                          iVar1 = atoi(val);
                                                          this->m_LSM9DS0CompassSampleRate = iVar1;
                                                        }
                                                        else {
                                                          iVar1 = bcmp(key,"LSM9DS0CompassFsr",0x12)
                                                          ;
                                                          if (iVar1 == 0) {
                                                            iVar1 = atoi(val);
                                                            this->m_LSM9DS0CompassFsr = iVar1;
                                                          }
                                                          else {
                                                            iVar1 = bcmp(key,"LSM9DS1GyroSampleRate"
                                                                         ,0x16);
                                                            if (iVar1 == 0) {
                                                              iVar1 = atoi(val);
                                                              this->m_LSM9DS1GyroSampleRate = iVar1;
                                                            }
                                                            else {
                                                              iVar1 = bcmp(key,"LSM9DS1GyroFsr",0xf)
                                                              ;
                                                              if (iVar1 == 0) {
                                                                iVar1 = atoi(val);
                                                                this->m_LSM9DS1GyroFsr = iVar1;
                                                              }
                                                              else {
                                                                iVar1 = bcmp(key,"LSM9DS1GyroHpf",
                                                                             0xf);
                                                                if (iVar1 == 0) {
                                                                  iVar1 = atoi(val);
                                                                  this->m_LSM9DS1GyroHpf = iVar1;
                                                                }
                                                                else {
                                                                  iVar1 = bcmp(key,"LSM9DS1GyroBW",
                                                                               0xe);
                                                                  if (iVar1 == 0) {
                                                                    iVar1 = atoi(val);
                                                                    this->m_LSM9DS1GyroBW = iVar1;
                                                                  }
                                                                  else {
                                                                    iVar1 = bcmp(key,
                                                  "LSM9DS1AccelSampleRate",0x17);
                                                  if (iVar1 == 0) {
                                                    iVar1 = atoi(val);
                                                    this->m_LSM9DS1AccelSampleRate = iVar1;
                                                  }
                                                  else {
                                                    auVar12[0] = -(key[0] == 'L');
                                                    auVar12[1] = -(key[1] == 'S');
                                                    auVar12[2] = -(key[2] == 'M');
                                                    auVar12[3] = -(key[3] == '9');
                                                    auVar12[4] = -(key[4] == 'D');
                                                    auVar12[5] = -(key[5] == 'S');
                                                    auVar12[6] = -(key[6] == '1');
                                                    auVar12[7] = -(key[7] == 'A');
                                                    auVar12[8] = -(key[8] == 'c');
                                                    auVar12[9] = -(key[9] == 'c');
                                                    auVar12[10] = -(key[10] == 'e');
                                                    auVar12[0xb] = -(key[0xb] == 'l');
                                                    auVar12[0xc] = -(key[0xc] == 'F');
                                                    auVar12[0xd] = -(key[0xd] == 's');
                                                    auVar12[0xe] = -(key[0xe] == 'r');
                                                    auVar12[0xf] = -(key[0xf] == '\0');
                                                    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1
                                                                         ) |
                                                                 (ushort)(SUB161(auVar12 >> 0xf,0) &
                                                                         1) << 1 |
                                                                 (ushort)(SUB161(auVar12 >> 0x17,0)
                                                                         & 1) << 2 |
                                                                 (ushort)(SUB161(auVar12 >> 0x1f,0)
                                                                         & 1) << 3 |
                                                                 (ushort)(SUB161(auVar12 >> 0x27,0)
                                                                         & 1) << 4 |
                                                                 (ushort)(SUB161(auVar12 >> 0x2f,0)
                                                                         & 1) << 5 |
                                                                 (ushort)(SUB161(auVar12 >> 0x37,0)
                                                                         & 1) << 6 |
                                                                 (ushort)(SUB161(auVar12 >> 0x3f,0)
                                                                         & 1) << 7 |
                                                                 (ushort)(SUB161(auVar12 >> 0x47,0)
                                                                         & 1) << 8 |
                                                                 (ushort)(SUB161(auVar12 >> 0x4f,0)
                                                                         & 1) << 9 |
                                                                 (ushort)(SUB161(auVar12 >> 0x57,0)
                                                                         & 1) << 10 |
                                                                 (ushort)(SUB161(auVar12 >> 0x5f,0)
                                                                         & 1) << 0xb |
                                                                 (ushort)(SUB161(auVar12 >> 0x67,0)
                                                                         & 1) << 0xc |
                                                                 (ushort)(SUB161(auVar12 >> 0x6f,0)
                                                                         & 1) << 0xd |
                                                                 (ushort)(SUB161(auVar12 >> 0x77,0)
                                                                         & 1) << 0xe |
                                                                (ushort)(auVar12[0xf] >> 7) << 0xf)
                                                        == 0xffff) {
                                                      iVar1 = atoi(val);
                                                      this->m_LSM9DS1AccelFsr = iVar1;
                                                    }
                                                    else {
                                                      auVar13[0] = -(key[0] == 'L');
                                                      auVar13[1] = -(key[1] == 'S');
                                                      auVar13[2] = -(key[2] == 'M');
                                                      auVar13[3] = -(key[3] == '9');
                                                      auVar13[4] = -(key[4] == 'D');
                                                      auVar13[5] = -(key[5] == 'S');
                                                      auVar13[6] = -(key[6] == '1');
                                                      auVar13[7] = -(key[7] == 'A');
                                                      auVar13[8] = -(key[8] == 'c');
                                                      auVar13[9] = -(key[9] == 'c');
                                                      auVar13[10] = -(key[10] == 'e');
                                                      auVar13[0xb] = -(key[0xb] == 'l');
                                                      auVar13[0xc] = -(key[0xc] == 'L');
                                                      auVar13[0xd] = -(key[0xd] == 'p');
                                                      auVar13[0xe] = -(key[0xe] == 'f');
                                                      auVar13[0xf] = -(key[0xf] == '\0');
                                                      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar13 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar13 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar13 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar13 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar13 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar13 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar13 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar13 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar13 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar13 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar13 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar13 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar13 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar13 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(auVar13[0xf] >> 7) << 0xf
                                                                  ) == 0xffff) {
                                                        iVar1 = atoi(val);
                                                        this->m_LSM9DS1AccelLpf = iVar1;
                                                      }
                                                      else {
                                                        iVar1 = bcmp(key,"LSM9DS1CompassSampleRate",
                                                                     0x19);
                                                        if (iVar1 == 0) {
                                                          iVar1 = atoi(val);
                                                          this->m_LSM9DS1CompassSampleRate = iVar1;
                                                        }
                                                        else {
                                                          iVar1 = bcmp(key,"LSM9DS1CompassFsr",0x12)
                                                          ;
                                                          if (iVar1 == 0) {
                                                            iVar1 = atoi(val);
                                                            this->m_LSM9DS1CompassFsr = iVar1;
                                                          }
                                                          else {
                                                            iVar1 = bcmp(key,"BMX055GyroSampleRate",
                                                                         0x15);
                                                            if (iVar1 == 0) {
                                                              iVar1 = atoi(val);
                                                              this->m_BMX055GyroSampleRate = iVar1;
                                                            }
                                                            else {
                                                              iVar1 = bcmp(key,"BMX055GyroFsr",0xe);
                                                              if (iVar1 == 0) {
                                                                iVar1 = atoi(val);
                                                                this->m_BMX055GyroFsr = iVar1;
                                                              }
                                                              else {
                                                                iVar1 = bcmp(key,
                                                  "BMX055AccelSampleRate",0x16);
                                                  if (iVar1 == 0) {
                                                    iVar1 = atoi(val);
                                                    this->m_BMX055AccelSampleRate = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = bcmp(key,"BMX055AccelFsr",0xf);
                                                    if (iVar1 == 0) {
                                                      iVar1 = atoi(val);
                                                      this->m_BMX055AccelFsr = iVar1;
                                                    }
                                                    else {
                                                      auVar14[0] = -(key[0] == 'B');
                                                      auVar14[1] = -(key[1] == 'M');
                                                      auVar14[2] = -(key[2] == 'X');
                                                      auVar14[3] = -(key[3] == '0');
                                                      auVar14[4] = -(key[4] == '5');
                                                      auVar14[5] = -(key[5] == '5');
                                                      auVar14[6] = -(key[6] == 'M');
                                                      auVar14[7] = -(key[7] == 'a');
                                                      auVar14[8] = -(key[8] == 'g');
                                                      auVar14[9] = -(key[9] == 'P');
                                                      auVar14[10] = -(key[10] == 'r');
                                                      auVar14[0xb] = -(key[0xb] == 'e');
                                                      auVar14[0xc] = -(key[0xc] == 's');
                                                      auVar14[0xd] = -(key[0xd] == 'e');
                                                      auVar14[0xe] = -(key[0xe] == 't');
                                                      auVar14[0xf] = -(key[0xf] == '\0');
                                                      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) &
                                                                           1) |
                                                                   (ushort)(SUB161(auVar14 >> 0xf,0)
                                                                           & 1) << 1 |
                                                                   (ushort)(SUB161(auVar14 >> 0x17,0
                                                                                  ) & 1) << 2 |
                                                                   (ushort)(SUB161(auVar14 >> 0x1f,0
                                                                                  ) & 1) << 3 |
                                                                   (ushort)(SUB161(auVar14 >> 0x27,0
                                                                                  ) & 1) << 4 |
                                                                   (ushort)(SUB161(auVar14 >> 0x2f,0
                                                                                  ) & 1) << 5 |
                                                                   (ushort)(SUB161(auVar14 >> 0x37,0
                                                                                  ) & 1) << 6 |
                                                                   (ushort)(SUB161(auVar14 >> 0x3f,0
                                                                                  ) & 1) << 7 |
                                                                   (ushort)(SUB161(auVar14 >> 0x47,0
                                                                                  ) & 1) << 8 |
                                                                   (ushort)(SUB161(auVar14 >> 0x4f,0
                                                                                  ) & 1) << 9 |
                                                                   (ushort)(SUB161(auVar14 >> 0x57,0
                                                                                  ) & 1) << 10 |
                                                                   (ushort)(SUB161(auVar14 >> 0x5f,0
                                                                                  ) & 1) << 0xb |
                                                                   (ushort)(SUB161(auVar14 >> 0x67,0
                                                                                  ) & 1) << 0xc |
                                                                   (ushort)(SUB161(auVar14 >> 0x6f,0
                                                                                  ) & 1) << 0xd |
                                                                   (ushort)(SUB161(auVar14 >> 0x77,0
                                                                                  ) & 1) << 0xe |
                                                                  (ushort)(auVar14[0xf] >> 7) << 0xf
                                                                  ) == 0xffff) {
                                                        iVar1 = atoi(val);
                                                        this->m_BMX055MagPreset = iVar1;
                                                      }
                                                      else {
                                                        fprintf(_stderr,
                                                  "Unrecognized key in settings file: %s\n",buf);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"Bad line in settings file: %s\n",buf);
  fclose((FILE *)this->m_fd);
  return false;
}

Assistant:

bool RTIMUSettings::loadSettings()
{
    setDefaults();

    char buf[200];
    char key[200];
    char val[200];
    RTFLOAT ftemp;
    //  check to see if settings file exists

    if (!(m_fd = fopen(m_filename, "r"))) {
        HAL_INFO("Settings file not found. Using defaults and creating settings file\n");
        return saveSettings();
    }

    while (fgets(buf, 200, m_fd)) {
        if ((buf[0] == '#') || (buf[0] == ' ') || (buf[0] == '\n'))
            // just a comment
            continue;

        if (sscanf(buf, "%[^=]=%s", key, val) != 2) {
            HAL_ERROR1("Bad line in settings file: %s\n", buf);
            fclose(m_fd);
            return false;
        }

        //  now decode keys

        //  general config

        if (strcmp(key, RTIMULIB_IMU_TYPE) == 0) {
            m_imuType = atoi(val);
        } else if (strcmp(key, RTIMULIB_FUSION_TYPE) == 0) {
            m_fusionType = atoi(val);
        } else if (strcmp(key, RTIMULIB_BUS_IS_I2C) == 0) {
            m_busIsI2C = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_I2C_BUS) == 0) {
            m_I2CBus = atoi(val);
        } else if (strcmp(key, RTIMULIB_SPI_BUS) == 0) {
            m_SPIBus = atoi(val);
        } else if (strcmp(key, RTIMULIB_SPI_SELECT) == 0) {
            m_SPISelect = atoi(val);
        } else if (strcmp(key, RTIMULIB_SPI_SPEED) == 0) {
            m_SPISpeed = atoi(val);
        } else if (strcmp(key, RTIMULIB_I2C_SLAVEADDRESS) == 0) {
            m_I2CSlaveAddress = atoi(val);
        } else if (strcmp(key, RTIMULIB_AXIS_ROTATION) == 0) {
            m_axisRotation = atoi(val);
        } else if (strcmp(key, RTIMULIB_PRESSURE_TYPE) == 0) {
            m_pressureType = atoi(val);
        } else if (strcmp(key, RTIMULIB_I2C_PRESSUREADDRESS) == 0) {
            m_I2CPressureAddress = atoi(val);
        } else if (strcmp(key, RTIMULIB_HUMIDITY_TYPE) == 0) {
            m_humidityType = atoi(val);
        } else if (strcmp(key, RTIMULIB_I2C_HUMIDITYADDRESS) == 0) {
            m_I2CHumidityAddress = atoi(val);

        // compass calibration and adjustment

        } else if (strcmp(key, RTIMULIB_COMPASSCAL_VALID) == 0) {
            m_compassCalValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MINX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMin.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MINY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMin.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MINZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMin.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MAXX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMax.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MAXY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMax.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MAXZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMax.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSADJ_DECLINATION) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassAdjDeclination = ftemp;

        // compass ellipsoid calibration

        } else if (strcmp(key, RTIMULIB_COMPASSCAL_ELLIPSOID_VALID) == 0) {
            m_compassCalEllipsoidValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_OFFSET_X) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidOffset.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_OFFSET_Y) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidOffset.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_OFFSET_Z) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidOffset.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR11) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[0][0] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR12) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[0][1] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR13) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[0][2] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR21) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[1][0] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR22) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[1][1] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR23) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[1][2] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR31) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[2][0] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR32) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[2][1] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR33) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[2][2] = ftemp;

        // accel calibration

        } else if (strcmp(key, RTIMULIB_ACCELCAL_VALID) == 0) {
            m_accelCalValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MINX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMin.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MINY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMin.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MINZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMin.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MAXX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMax.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MAXY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMax.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MAXZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMax.setZ(ftemp);

            // gyro bias

        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_VALID) == 0) {
            m_gyroBiasValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_X) == 0) {
            sscanf(val, "%f", &ftemp);
            m_gyroBias.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_Y) == 0) {
            sscanf(val, "%f", &ftemp);
            m_gyroBias.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_Z) == 0) {
            sscanf(val, "%f", &ftemp);
            m_gyroBias.setZ(ftemp);

        //  MPU9150 settings

        } else if (strcmp(key, RTIMULIB_MPU9150_GYROACCEL_SAMPLERATE) == 0) {
            m_MPU9150GyroAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_COMPASS_SAMPLERATE) == 0) {
            m_MPU9150CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_GYROACCEL_LPF) == 0) {
            m_MPU9150GyroAccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_GYRO_FSR) == 0) {
            m_MPU9150GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_ACCEL_FSR) == 0) {
            m_MPU9150AccelFsr = atoi(val);

        //  MPU9250 settings

        } else if (strcmp(key, RTIMULIB_MPU9250_GYROACCEL_SAMPLERATE) == 0) {
            m_MPU9250GyroAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_COMPASS_SAMPLERATE) == 0) {
            m_MPU9250CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_GYRO_LPF) == 0) {
            m_MPU9250GyroLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_ACCEL_LPF) == 0) {
            m_MPU9250AccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_GYRO_FSR) == 0) {
            m_MPU9250GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_ACCEL_FSR) == 0) {
            m_MPU9250AccelFsr = atoi(val);

        //  GD20HM303D settings

        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_SAMPLERATE) == 0) {
            m_GD20HM303DGyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_FSR) == 0) {
            m_GD20HM303DGyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_HPF) == 0) {
            m_GD20HM303DGyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_BW) == 0) {
            m_GD20HM303DGyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_ACCEL_SAMPLERATE) == 0) {
            m_GD20HM303DAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_ACCEL_FSR) == 0) {
            m_GD20HM303DAccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_ACCEL_LPF) == 0) {
            m_GD20HM303DAccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_COMPASS_SAMPLERATE) == 0) {
            m_GD20HM303DCompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_COMPASS_FSR) == 0) {
            m_GD20HM303DCompassFsr = atoi(val);

        //  GD20M303DLHC settings

        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_SAMPLERATE) == 0) {
            m_GD20M303DLHCGyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_FSR) == 0) {
            m_GD20M303DLHCGyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_HPF) == 0) {
            m_GD20M303DLHCGyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_BW) == 0) {
            m_GD20M303DLHCGyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_ACCEL_SAMPLERATE) == 0) {
            m_GD20M303DLHCAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_ACCEL_FSR) == 0) {
            m_GD20M303DLHCAccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_COMPASS_SAMPLERATE) == 0) {
            m_GD20M303DLHCCompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_COMPASS_FSR) == 0) {
            m_GD20M303DLHCCompassFsr = atoi(val);

        //  GD20HM303DLHC settings

         } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_SAMPLERATE) == 0) {
            m_GD20HM303DLHCGyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_FSR) == 0) {
            m_GD20HM303DLHCGyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_HPF) == 0) {
            m_GD20HM303DLHCGyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_BW) == 0) {
            m_GD20HM303DLHCGyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_ACCEL_SAMPLERATE) == 0) {
            m_GD20HM303DLHCAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_ACCEL_FSR) == 0) {
            m_GD20HM303DLHCAccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_COMPASS_SAMPLERATE) == 0) {
            m_GD20HM303DLHCCompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_COMPASS_FSR) == 0) {
            m_GD20HM303DLHCCompassFsr = atoi(val);

        //  LSM9DS0 settings

        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_SAMPLERATE) == 0) {
            m_LSM9DS0GyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_FSR) == 0) {
            m_LSM9DS0GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_HPF) == 0) {
            m_LSM9DS0GyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_BW) == 0) {
            m_LSM9DS0GyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_ACCEL_SAMPLERATE) == 0) {
            m_LSM9DS0AccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_ACCEL_FSR) == 0) {
            m_LSM9DS0AccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_ACCEL_LPF) == 0) {
            m_LSM9DS0AccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_COMPASS_SAMPLERATE) == 0) {
            m_LSM9DS0CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_COMPASS_FSR) == 0) {
            m_LSM9DS0CompassFsr = atoi(val);

        //  LSM9DS1 settings

        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_SAMPLERATE) == 0) {
            m_LSM9DS1GyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_FSR) == 0) {
            m_LSM9DS1GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_HPF) == 0) {
            m_LSM9DS1GyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_BW) == 0) {
            m_LSM9DS1GyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_ACCEL_SAMPLERATE) == 0) {
            m_LSM9DS1AccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_ACCEL_FSR) == 0) {
            m_LSM9DS1AccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_ACCEL_LPF) == 0) {
            m_LSM9DS1AccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_COMPASS_SAMPLERATE) == 0) {
            m_LSM9DS1CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_COMPASS_FSR) == 0) {
            m_LSM9DS1CompassFsr = atoi(val);

        //  BMX055 settings

        } else if (strcmp(key, RTIMULIB_BMX055_GYRO_SAMPLERATE) == 0) {
            m_BMX055GyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_GYRO_FSR) == 0) {
            m_BMX055GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_ACCEL_SAMPLERATE) == 0) {
            m_BMX055AccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_ACCEL_FSR) == 0) {
            m_BMX055AccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_MAG_PRESET) == 0) {
            m_BMX055MagPreset = atoi(val);

        //  Handle unrecognized key

        } else {
            HAL_ERROR1("Unrecognized key in settings file: %s\n", buf);
        }
    }
    HAL_INFO1("Settings file %s loaded\n", m_filename);
    fclose(m_fd);
    return saveSettings();                                  // make sure settings file is correct and complete
}